

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void open_file(string *filename,ifstream *file_stream)

{
  ulong uVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  string err_msg;
  string local_30 [32];
  
  std::ifstream::open((string *)in_RSI,(_Ios_Openmode)in_RDI);
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) == 0) {
    return;
  }
  std::operator+(in_RDI,in_RSI);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,local_30);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void open_file(const std::string filename, std::ifstream& file_stream) {
	file_stream.open(filename);
	if (file_stream.fail()) {
		std::string err_msg = "couldn't open file " + filename;
		throw std::runtime_error(err_msg);
	}
}